

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O1

int ftxui::wchar_width(wchar_t ucs)

{
  bool bVar1;
  int iVar2;
  
  iVar2 = -1;
  if (ucs != L'\0') {
    bVar1 = (uint)(ucs + L'\xffffff81') < 0x21;
    if ((uint)ucs < 0x20) {
      bVar1 = ucs != L'\n';
    }
    if (!bVar1) {
      bVar1 = IsCombining(ucs);
      iVar2 = 0;
      if (!bVar1) {
        bVar1 = IsFullWidth(ucs);
        iVar2 = bVar1 + 1;
      }
    }
  }
  return iVar2;
}

Assistant:

int wchar_width(wchar_t ucs) {
  return codepoint_width(uint32_t(ucs));
}